

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-eval-util.hh
# Opt level: O3

vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_> *
tinyusdz::lerp<tinyusdz::value::quatd>
          (vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>
           *__return_storage_ptr__,
          vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_> *a,
          vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_> *b,double t)

{
  double *pdVar1;
  pointer pqVar2;
  ulong uVar3;
  long lVar4;
  ulong __new_size;
  quatd local_50;
  
  (__return_storage_ptr__->
  super__Vector_base<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar3 = (long)(a->
                super__Vector_base<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>)
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(a->
                super__Vector_base<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>)
                ._M_impl.super__Vector_impl_data._M_start >> 5;
  __new_size = (long)(b->
                     super__Vector_base<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(b->
                     super__Vector_base<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 5;
  if (uVar3 <= __new_size) {
    __new_size = uVar3;
  }
  if (__new_size != 0) {
    ::std::vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>::resize
              (__return_storage_ptr__,__new_size);
    if ((long)(a->
              super__Vector_base<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>).
              _M_impl.super__Vector_impl_data._M_finish -
        (long)(a->
              super__Vector_base<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>).
              _M_impl.super__Vector_impl_data._M_start ==
        (long)(b->
              super__Vector_base<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>).
              _M_impl.super__Vector_impl_data._M_finish -
        (long)(b->
              super__Vector_base<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>).
              _M_impl.super__Vector_impl_data._M_start) {
      lVar4 = 0;
      do {
        slerp(&local_50,
              (quatd *)((long)(((a->
                                super__Vector_base<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>
                                )._M_impl.super__Vector_impl_data._M_start)->imag)._M_elems + lVar4)
              ,(quatd *)((long)(((b->
                                 super__Vector_base<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>
                                 )._M_impl.super__Vector_impl_data._M_start)->imag)._M_elems + lVar4
                        ),t);
        pqVar2 = (__return_storage_ptr__->
                 super__Vector_base<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pdVar1 = (double *)((long)(pqVar2->imag)._M_elems + lVar4 + 0x10);
        *pdVar1 = local_50.imag._M_elems[2];
        pdVar1[1] = local_50.real;
        pdVar1 = (double *)((long)(pqVar2->imag)._M_elems + lVar4);
        *pdVar1 = local_50.imag._M_elems[0];
        pdVar1[1] = local_50.imag._M_elems[1];
        lVar4 = lVar4 + 0x20;
        __new_size = __new_size - 1;
      } while (__new_size != 0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<T> lerp(const std::vector<T> &a, const std::vector<T> &b,
                           const double t) {
  std::vector<T> dst;

  // Choose shorter one
  size_t n = std::min(a.size(), b.size());
  if (n == 0) {
    return dst;
  }

  dst.resize(n);

  if (a.size() != b.size()) {
    return dst;
  }
  for (size_t i = 0; i < n; i++) {
    dst[i] = lerp(a[i], b[i], t);
  }

  return dst;
}